

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmSyRU.cpp
# Opt level: O2

void __thiscall EmSyRU::uploadLog(EmSyRU *this)

{
  string *__rhs;
  int iVar1;
  ostream *poVar2;
  allocator local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_c8,"STATUS: Uploading logfile to ",&local_c9);
  poVar2 = operator<<(&log_,&local_c8);
  __rhs = &this->logFile_;
  std::operator+(&local_a8,&this->upURL_,__rhs);
  poVar2 = std::operator<<(poVar2,(string *)&local_a8);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::operator+(&local_68,&this->upURL_,__rhs);
  std::__cxx11::string::string((string *)&local_88,(string *)__rhs);
  iVar1 = CurlCommunicator::startUpload(&this->curli_,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  if (iVar1 == 0) {
    std::__cxx11::string::string
              ((string *)&local_c8,"ERROR: Failed to upload logfile ",(allocator *)&local_a8);
    poVar2 = operator<<(&log_,&local_c8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  std::__cxx11::string::string((string *)&local_48,(string *)&this->env_);
  UnixBridge::deleteDir(&this->ub_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void EmSyRU::uploadLog()
{
	log_ << "STATUS: Uploading logfile to " << upURL_ + logFile_ << endl;
	if(!curli_.startUpload(upURL_ + logFile_, logFile_))
		log_ << "ERROR: Failed to upload logfile " << endl;
	ub_.deleteDir(env_);
}